

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O1

void __thiscall cfdcapi_psbt_ParsePsbtHex_Test::TestBody(cfdcapi_psbt_ParsePsbtHex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *output;
  int ret;
  void *psbt_handle;
  AssertionResult gtest_ar;
  void *handle;
  AssertHelper local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  int local_4c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  void *local_18;
  
  local_18 = (void *)0x0;
  local_4c = CfdCreateHandle(&local_18);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_4c);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_1_ = local_18 != (void *)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18 == (void *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb1,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.data_ = (AssertHelperData *)0x0;
  pcVar2 = "";
  local_4c = CfdCreatePsbtHandle(local_18,1,
                                 "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
                                 ,"",0,0,&local_48.ptr_);
  local_68.data_ = (AssertHelperData *)((ulong)local_68.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_4c);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_38._M_string_length != (undefined8 *)0x0) {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_4c == 0) {
    local_4c = CfdGetPsbtData(local_18,local_48.ptr_,(char **)0x0,(char **)&local_58);
    local_68.data_ = local_68.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_4c);
    if ((char)local_38._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_38._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xbc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
        local_68.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_4c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_38,"exp_psbt","output",
                 "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
                 ,(char *)local_58.data_);
      if ((char)local_38._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_38._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xbe,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
          local_68.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_38._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_58.data_);
      local_58.data_ = (AssertHelperData *)0x0;
    }
    local_4c = CfdFreePsbtHandle(local_18,local_48.ptr_);
    local_68.data_ = local_68.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_4c);
    if ((char)local_38._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_38._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xc4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
        local_68.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  CfdcapiPsbtDumpLog(local_4c,local_18);
  local_4c = CfdFreeHandle(local_18);
  local_68.data_ = local_68.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_4c);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_psbt, ParsePsbtHex) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt = "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, exp_psbt, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdGetPsbtData(handle, psbt_handle, nullptr, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  CfdcapiPsbtDumpLog(ret, handle);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}